

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O0

void __thiscall
gimage::HighDynamicRangeFusionBase::HighDynamicRangeFusionBase(HighDynamicRangeFusionBase *this)

{
  reference pvVar1;
  vector<float,_std::allocator<float>_> *in_RDI;
  double dVar2;
  int x;
  int i;
  double inv_var;
  int n;
  vector<float,_std::allocator<float>_> *__new_size;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  
  __new_size = in_RDI;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1583d0);
  std::
  vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
  ::vector((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
            *)0x1583e3);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(size_type)__new_size);
  for (iVar3 = 0; iVar3 < 0x100; iVar3 = iVar3 + 1) {
    dVar2 = exp((double)(iVar3 + -0x80) * -0.5 * (double)(iVar3 + -0x80) * 0.00038446751249519417);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)iVar3);
    *pvVar1 = (float)dVar2;
  }
  return;
}

Assistant:

HighDynamicRangeFusionBase::HighDynamicRangeFusionBase()
{
  // create lookup table for Gauss curve

  int n=256;
  gauss.resize(n);

  double inv_var=1.0/(51*51); // standard deviation of 0.2 for value range 0 to 1

  for (int i=0; i<n; i++)
  {
    int x=i-(n>>1);
    gauss[i]=static_cast<float>(std::exp(-0.5*x*x*inv_var));
  }
}